

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

void __thiscall
Units_compareUnitsCompatibleComplex_Test::TestBody(Units_compareUnitsCompatibleComplex_Test *this)

{
  element_type *peVar1;
  element_type *peVar2;
  char *local_b8 [4];
  allocator<char> local_98 [8];
  allocator<char> local_90 [15];
  allocator<char> local_81;
  ModelPtr model;
  UnitsPtr u2;
  UnitsPtr u1;
  AssertionResult gtest_ar_;
  UnitsPtr u;
  
  libcellml::Units::create();
  peVar2 = u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b8,"u",(allocator<char> *)&model);
  libcellml::NamedEntity::setName((string *)peVar2);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b8,"micro",(allocator<char> *)&gtest_ar_);
  std::__cxx11::string::string<std::allocator<char>>((string *)&model,"",(allocator<char> *)&u1);
  libcellml::Units::addUnit
            ((StandardUnit)u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             ,(string *)0x2,2.0,3.0,(string *)local_b8);
  std::__cxx11::string::~string((string *)&model);
  std::__cxx11::string::~string((string *)local_b8);
  libcellml::Units::create();
  peVar2 = u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b8,"u1",(allocator<char> *)&model);
  libcellml::NamedEntity::setName((string *)peVar2);
  std::__cxx11::string::~string((string *)local_b8);
  peVar2 = u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b8,"metre",(allocator<char> *)&u2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&model,"milli",local_90);
  std::__cxx11::string::string<std::allocator<char>>((string *)&gtest_ar_,"",local_98);
  libcellml::Units::addUnit((string *)peVar2,(string *)local_b8,2.0,1.0,(string *)&model);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  std::__cxx11::string::~string((string *)&model);
  std::__cxx11::string::~string((string *)local_b8);
  peVar2 = u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b8,"milli",(allocator<char> *)&gtest_ar_);
  std::__cxx11::string::string<std::allocator<char>>((string *)&model,"",(allocator<char> *)&u2);
  libcellml::Units::addUnit((StandardUnit)peVar2,(string *)0x0,1.0,1.0,(string *)local_b8);
  std::__cxx11::string::~string((string *)&model);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b8,"u",(allocator<char> *)&model);
  libcellml::Units::addUnit
            ((string *)u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::~string((string *)local_b8);
  libcellml::Units::create();
  peVar2 = u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b8,"u2",(allocator<char> *)&model);
  libcellml::NamedEntity::setName((string *)peVar2);
  std::__cxx11::string::~string((string *)local_b8);
  peVar2 = u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b8,"",(allocator<char> *)&model);
  libcellml::Units::addUnit((StandardUnit)peVar2,0,1.0,3.0,(string *)0x0);
  std::__cxx11::string::~string((string *)local_b8);
  peVar2 = u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b8,"u",(allocator<char> *)&model);
  libcellml::Units::addUnit((string *)peVar2);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_b8,"metre",local_90);
  std::__cxx11::string::string<std::allocator<char>>((string *)&model,"milli",local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&gtest_ar_,"",&local_81);
  libcellml::Units::addUnit
            ((string *)u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (string *)local_b8,2.0,1.0,(string *)&model);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  std::__cxx11::string::~string((string *)&model);
  std::__cxx11::string::~string((string *)local_b8);
  libcellml::Model::create();
  peVar1 = model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b8,"model",(allocator<char> *)&gtest_ar_);
  libcellml::NamedEntity::setName((string *)peVar1);
  std::__cxx11::string::~string((string *)local_b8);
  libcellml::Model::addUnits
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Model::addUnits
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Model::addUnits
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  gtest_ar_.success_ = (bool)libcellml::Units::compatible((shared_ptr *)&u1,(shared_ptr *)&u2);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_b8,&gtest_ar_.success_,
               "libcellml::Units::compatible(u1, u2)","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x6c5,local_b8[0]);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_98,(Message *)local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_98);
    std::__cxx11::string::~string((string *)local_b8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_90);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = (bool)libcellml::Units::compatible((shared_ptr *)&u2,(shared_ptr *)&u1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_b8,&gtest_ar_.success_,
               "libcellml::Units::compatible(u2, u1)","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x6c6,local_b8[0]);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_98,(Message *)local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_98);
    std::__cxx11::string::~string((string *)local_b8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_90);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Units, compareUnitsCompatibleComplex)
{
    libcellml::UnitsPtr u = libcellml::Units::create();
    u->setName("u");
    u->addUnit(libcellml::Units::StandardUnit::CANDELA, "micro", 2.0, 3.0);

    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("u1");
    u1->addUnit("metre", "milli", 2.0, 1.0);
    u1->addUnit(libcellml::Units::StandardUnit::AMPERE, "milli", 1.0, 1.0);
    u1->addUnit("u");

    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("u2");
    u2->addUnit(libcellml::Units::StandardUnit::AMPERE, 0, 1.0, 3.0);
    u2->addUnit("u");
    u2->addUnit("metre", "milli", 2.0, 1.0); // Only unit attributes which matter now are the exponent and the base unit. Not interested in multipliers.

    libcellml::ModelPtr model = libcellml::Model::create();
    model->setName("model");
    model->addUnits(u);
    model->addUnits(u1);
    model->addUnits(u2);

    EXPECT_TRUE(libcellml::Units::compatible(u1, u2));
    EXPECT_TRUE(libcellml::Units::compatible(u2, u1));
}